

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::TimecodeComponent::Dump(TimecodeComponent *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [128];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  StructuralComponent::Dump(&this->super_StructuralComponent,stream);
  fprintf((FILE *)stream,"  %22s = %d\n","RoundedTimecodeBase",(ulong)this->RoundedTimecodeBase);
  pcVar1 = i64sz(this->StartTimecode,local_98);
  fprintf((FILE *)stream,"  %22s = %s\n","StartTimecode",pcVar1);
  fprintf((FILE *)stream,"  %22s = %d\n","DropFrame",(ulong)this->DropFrame);
  return;
}

Assistant:

void
TimecodeComponent::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  StructuralComponent::Dump(stream);
  fprintf(stream, "  %22s = %d\n",  "RoundedTimecodeBase", RoundedTimecodeBase);
  fprintf(stream, "  %22s = %s\n",  "StartTimecode", i64sz(StartTimecode, identbuf));
  fprintf(stream, "  %22s = %d\n",  "DropFrame", DropFrame);
}